

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

void __thiscall
fmt::v5::
basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
::write_decimal<unsigned_int>
          (basic_writer<fmt::v5::output_range<fmt::v5::internal::truncating_iterator<char_*,_std::integral_constant<bool,_false>_>,_char>_>
           *this,uint value)

{
  ulong uVar1;
  bool bVar2;
  value_type vVar3;
  uint uVar4;
  uint uVar5;
  value_type *pvVar7;
  size_t sVar8;
  value_type vVar9;
  value_type *pvVar10;
  ulong uVar11;
  byte bVar12;
  long lVar13;
  value_type avStack_15 [13];
  ulong uVar6;
  
  uVar4 = 0x1f;
  if ((value | 1) != 0) {
    for (; (value | 1) >> uVar4 == 0; uVar4 = uVar4 - 1) {
    }
  }
  uVar4 = (uVar4 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
  uVar5 = (uVar4 - (value < *(uint *)(internal::basic_data<void>::ZERO_OR_POWERS_OF_10_32 +
                                     (ulong)uVar4 * 4))) + 1;
  uVar6 = (ulong)uVar5;
  pvVar10 = avStack_15 + uVar6;
  uVar4 = value;
  if (99 < value) {
    do {
      value = uVar4 / 100;
      *(undefined2 *)(pvVar10 + -2) =
           *(undefined2 *)(internal::basic_data<void>::DIGITS + (ulong)(uVar4 % 100) * 2);
      pvVar10 = pvVar10 + -2;
      bVar2 = 9999 < uVar4;
      uVar4 = uVar4 / 100;
    } while (bVar2);
  }
  pvVar7 = (this->out_).super_truncating_iterator_base<char_*>.out_;
  uVar1 = (this->out_).super_truncating_iterator_base<char_*>.limit_;
  sVar8 = (this->out_).super_truncating_iterator_base<char_*>.count_;
  vVar9 = (this->out_).blackhole_;
  if (value < 10) {
    bVar12 = (byte)value | 0x30;
    lVar13 = -1;
  }
  else {
    pvVar10[-1] = internal::basic_data<void>::DIGITS[((ulong)value * 2 & 0xffffffff) + 1];
    bVar12 = internal::basic_data<void>::DIGITS[(ulong)value * 2];
    lVar13 = -2;
  }
  pvVar10[lVar13] = bVar12;
  if (0 < (int)uVar5) {
    uVar11 = 0;
    do {
      vVar3 = avStack_15[uVar11];
      if (sVar8 + uVar11 < uVar1) {
        *pvVar7 = avStack_15[uVar11];
        pvVar7 = pvVar7 + 1;
        vVar3 = vVar9;
      }
      vVar9 = vVar3;
      uVar11 = uVar11 + 1;
    } while (uVar6 != uVar11);
    sVar8 = sVar8 + uVar6;
  }
  (this->out_).super_truncating_iterator_base<char_*>.out_ = pvVar7;
  (this->out_).super_truncating_iterator_base<char_*>.limit_ = uVar1;
  (this->out_).super_truncating_iterator_base<char_*>.count_ = sVar8;
  (this->out_).blackhole_ = vVar9;
  return;
}

Assistant:

inline int count_digits(uint32_t n) {
  int t = (32 - FMT_BUILTIN_CLZ(n | 1)) * 1233 >> 12;
  return t - (n < data::ZERO_OR_POWERS_OF_10_32[t]) + 1;
}